

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  undefined8 uVar1;
  char cVar2;
  uint in_ECX;
  
  cVar2 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if (cVar2 == '\0') {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    (this->items).d.d = (Data *)0x0;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(__s + 0x18) + (long)__c * 8);
    *(int *)this = __c;
    *(uint *)&this->field_0x4 = in_ECX;
    *(undefined8 *)&this->field_0x8 = uVar1;
    (this->items).d.d = (Data *)__s;
  }
  return (char *)this;
}

Assistant:

QModelIndex QListModel::index(int row, int column, const QModelIndex &parent) const
{
    if (hasIndex(row, column, parent))
        return createIndex(row, column, items.at(row));
    return QModelIndex();
}